

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void * tinfl_decompress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  long lVar1;
  tinfl_status tVar2;
  void *pvVar3;
  long *in_RDX;
  tinfl_status status;
  size_t new_out_buf_capacity;
  size_t dst_buf_size;
  size_t src_buf_size;
  size_t out_buf_capacity;
  size_t src_buf_ofs;
  void *pNew_buf;
  void *pBuf;
  tinfl_decompressor decomp;
  size_t local_2b58;
  size_t local_2b40;
  void *local_2b28;
  size_t *in_stack_ffffffffffffd6e0;
  mz_uint8 *in_stack_ffffffffffffd6e8;
  mz_uint8 *in_stack_ffffffffffffd6f0;
  size_t *in_stack_ffffffffffffd6f8;
  mz_uint8 *in_stack_ffffffffffffd700;
  tinfl_decompressor *in_stack_ffffffffffffd708;
  mz_uint32 in_stack_ffffffffffffd720;
  
  local_2b28 = (void *)0x0;
  local_2b40 = 0;
  *in_RDX = 0;
  while( true ) {
    lVar1 = *in_RDX;
    tVar2 = tinfl_decompress(in_stack_ffffffffffffd708,in_stack_ffffffffffffd700,
                             in_stack_ffffffffffffd6f8,in_stack_ffffffffffffd6f0,
                             in_stack_ffffffffffffd6e8,in_stack_ffffffffffffd6e0,
                             in_stack_ffffffffffffd720);
    if ((tVar2 < TINFL_STATUS_DONE) || (tVar2 == TINFL_STATUS_NEEDS_MORE_INPUT)) {
      free(local_2b28);
      *in_RDX = 0;
      return (void *)0x0;
    }
    *in_RDX = (local_2b40 - lVar1) + *in_RDX;
    if (tVar2 == TINFL_STATUS_DONE) {
      return local_2b28;
    }
    local_2b58 = local_2b40 << 1;
    if (local_2b58 < 0x80) {
      local_2b58 = 0x80;
    }
    pvVar3 = realloc(local_2b28,local_2b58);
    if (pvVar3 == (void *)0x0) break;
    local_2b40 = local_2b58;
    local_2b28 = pvVar3;
  }
  free(local_2b28);
  *in_RDX = 0;
  return (void *)0x0;
}

Assistant:

void *tinfl_decompress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len,
                                   size_t *pOut_len, int flags) {
  tinfl_decompressor decomp;
  void *pBuf = NULL, *pNew_buf;
  size_t src_buf_ofs = 0, out_buf_capacity = 0;
  *pOut_len = 0;
  tinfl_init(&decomp);
  for (;;) {
    size_t src_buf_size = src_buf_len - src_buf_ofs,
           dst_buf_size = out_buf_capacity - *pOut_len, new_out_buf_capacity;
    tinfl_status status = tinfl_decompress(
        &decomp, (const mz_uint8 *)pSrc_buf + src_buf_ofs, &src_buf_size,
        (mz_uint8 *)pBuf, pBuf ? (mz_uint8 *)pBuf + *pOut_len : NULL,
        &dst_buf_size, (flags & ~TINFL_FLAG_HAS_MORE_INPUT) |
                           TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
    if ((status < 0) || (status == TINFL_STATUS_NEEDS_MORE_INPUT)) {
      MZ_FREE(pBuf);
      *pOut_len = 0;
      return NULL;
    }
    src_buf_ofs += src_buf_size;
    *pOut_len += dst_buf_size;
    if (status == TINFL_STATUS_DONE)
      break;
    new_out_buf_capacity = out_buf_capacity * 2;
    if (new_out_buf_capacity < 128)
      new_out_buf_capacity = 128;
    pNew_buf = MZ_REALLOC(pBuf, new_out_buf_capacity);
    if (!pNew_buf) {
      MZ_FREE(pBuf);
      *pOut_len = 0;
      return NULL;
    }
    pBuf = pNew_buf;
    out_buf_capacity = new_out_buf_capacity;
  }
  return pBuf;
}